

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O0

AMQP_VALUE messaging_delivery_rejected(char *error_condition,char *error_description)

{
  bool bVar1;
  int iVar2;
  REJECTED_HANDLE rejected_00;
  LOGGER_LOG p_Var3;
  ERROR_HANDLE error;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  _Bool error_constructing;
  ERROR_HANDLE error_handle;
  LOGGER_LOG l;
  REJECTED_HANDLE rejected;
  AMQP_VALUE result;
  char *error_description_local;
  char *error_condition_local;
  
  rejected_00 = rejected_create();
  if (rejected_00 == (REJECTED_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                ,"messaging_delivery_rejected",0xa5,1,"Cannot create REJECTED delivery state handle"
               );
    }
    rejected = (REJECTED_HANDLE)0x0;
  }
  else {
    bVar1 = false;
    if (error_condition != (char *)0x0) {
      error = error_create(error_condition);
      if (error == (ERROR_HANDLE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                    ,"messaging_delivery_rejected",0xb2,1,
                    "Cannot create error AMQP value for REJECTED state");
        }
        bVar1 = true;
      }
      else {
        if ((error_description == (char *)0x0) ||
           (iVar2 = error_set_description(error,error_description), iVar2 == 0)) {
          iVar2 = rejected_set_error(rejected_00,error);
          if (iVar2 != 0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                        ,"messaging_delivery_rejected",0xc1,1,
                        "Cannot set error on REJECTED state handle");
            }
            bVar1 = true;
          }
        }
        else {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                      ,"messaging_delivery_rejected",0xba,1,
                      "Cannot set error description on error AMQP value for REJECTED state");
          }
          bVar1 = true;
        }
        error_destroy(error);
      }
    }
    if (bVar1) {
      rejected = (REJECTED_HANDLE)0x0;
    }
    else {
      rejected = (REJECTED_HANDLE)amqpvalue_create_rejected(rejected_00);
      if (((AMQP_VALUE)rejected == (AMQP_VALUE)0x0) &&
         (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                  ,"messaging_delivery_rejected",0xd3,1,
                  "Cannot create REJECTED delivery state AMQP value");
      }
    }
    rejected_destroy(rejected_00);
  }
  return (AMQP_VALUE)rejected;
}

Assistant:

AMQP_VALUE messaging_delivery_rejected(const char* error_condition, const char* error_description)
{
    AMQP_VALUE result;
    REJECTED_HANDLE rejected = rejected_create();
    if (rejected == NULL)
    {
        LogError("Cannot create REJECTED delivery state handle");
        result = NULL;
    }
    else
    {
        ERROR_HANDLE error_handle = NULL;
        bool error_constructing = false;

        if (error_condition != NULL)
        {
            error_handle = error_create(error_condition);
            if (error_handle == NULL)
            {
                LogError("Cannot create error AMQP value for REJECTED state");
                error_constructing = true;
            }
            else
            {
                if ((error_description != NULL) &&
                    (error_set_description(error_handle, error_description) != 0))
                {
                    LogError("Cannot set error description on error AMQP value for REJECTED state");
                    error_constructing = true;
                }
                else
                {
                    if (rejected_set_error(rejected, error_handle) != 0)
                    {
                        LogError("Cannot set error on REJECTED state handle");
                        error_constructing = true;
                    }
                }

                error_destroy(error_handle);
            }
        }

        if (error_constructing)
        {
            result = NULL;
        }
        else
        {
            result = amqpvalue_create_rejected(rejected);
            if (result == NULL)
            {
                LogError("Cannot create REJECTED delivery state AMQP value");
            }
            else
            {
                /* all ok */
            }
        }

        rejected_destroy(rejected);
    }

    return result;
}